

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O3

int32 __thiscall
Js::JavascriptArray::HeadSegmentIndexOfHelper
          (JavascriptArray *this,Var search,uint32 *fromIndex,uint32 toIndex,bool includesAlgorithm,
          ScriptContext *scriptContext)

{
  Type TVar1;
  code *pcVar2;
  bool bVar3;
  DynamicObjectFlags DVar4;
  BOOL BVar5;
  undefined4 *puVar6;
  undefined1 *aLeft;
  uint uVar7;
  uint index;
  uint32 uVar8;
  SparseArraySegmentBase *this_00;
  
  TVar1 = ((this->super_ArrayObject).super_DynamicObject.super_RecyclableObject.type.ptr)->typeId;
  if (((3 < TVar1 - TypeIds_Array) || (TVar1 == TypeIds_ArrayLast)) ||
     (TVar1 == TypeIds_NativeIntArray)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x10a7,
                                "(IsNonES5Array(GetTypeId()) && !JavascriptNativeArray::Is(GetTypeId()))"
                                ,
                                "IsNonES5Array(GetTypeId()) && !JavascriptNativeArray::Is(GetTypeId())"
                               );
    if (!bVar3) goto LAB_00b74a76;
    *puVar6 = 0;
  }
  DVar4 = DynamicObject::GetArrayFlags((DynamicObject *)this);
  if ((DVar4 & HasNoMissingValues) != None) {
    index = *fromIndex;
    this_00 = (this->head).ptr;
    uVar7 = this_00->length;
    if (index < uVar7) {
      if (((ulong)search & 0x1ffff00000000) != 0x1000000000000 &&
          ((ulong)search & 0xffff000000000000) == 0x1000000000000) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar6 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                    ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                    "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
        if (!bVar3) {
LAB_00b74a76:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar6 = 0;
        this_00 = (this->head).ptr;
        uVar7 = this_00->length;
        index = *fromIndex;
      }
      uVar8 = toIndex;
      if (uVar7 < toIndex) {
        uVar8 = uVar7;
      }
      if (index < uVar8) {
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        do {
          aLeft = (undefined1 *)
                  SparseArraySegment<void_*>::GetElement
                            ((SparseArraySegment<void_*> *)this_00,index);
          if (((ulong)search & 0xffff000000000000) == 0x1000000000000) {
            if (((ulong)aLeft & 0x1ffff00000000) == 0x1000000000000 ||
                ((ulong)aLeft & 0xffff000000000000) != 0x1000000000000) {
              if (((ulong)aLeft & 0xffff000000000000) != 0x1000000000000) goto LAB_00b749b7;
            }
            else {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              *puVar6 = 1;
              bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                          ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                          "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
              if (!bVar3) goto LAB_00b74a76;
              *puVar6 = 0;
            }
            if (aLeft == (undefined1 *)search) {
              return index;
            }
          }
          else {
LAB_00b749b7:
            if (aLeft == &DAT_40002fff80002) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              *puVar6 = 1;
              bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                          ,0x10c0,"(false)","false");
              if (!bVar3) goto LAB_00b74a76;
              *puVar6 = 0;
            }
            else {
              if ((includesAlgorithm) &&
                 (bVar3 = JavascriptConversion::SameValueCommon<true>(aLeft,search), bVar3)) {
                return index;
              }
              BVar5 = JavascriptOperators::StrictEqual(aLeft,search,scriptContext);
              if (BVar5 != 0) {
                return index;
              }
            }
          }
          index = index + 1;
        } while (uVar8 != index);
        uVar7 = ((this->head).ptr)->length;
      }
      if (toIndex <= uVar7) {
        uVar7 = 0xffffffff;
      }
      *fromIndex = uVar7;
    }
  }
  return -1;
}

Assistant:

int32 JavascriptArray::HeadSegmentIndexOfHelper(Var search, uint32 &fromIndex, uint32 toIndex, bool includesAlgorithm, ScriptContext * scriptContext)
    {
        Assert(IsNonES5Array(GetTypeId()) && !JavascriptNativeArray::Is(GetTypeId()));

        if (!HasNoMissingValues() || fromIndex >= GetHead()->length)
        {
            return -1;
        }

        bool isSearchTaggedInt = TaggedInt::Is(search);
        // We need to cast head segment to SparseArraySegment<Var> to have access to GetElement (onSparseArraySegment<T>). Because there are separate overloads of this
        // virtual method on JavascriptNativeIntArray and JavascriptNativeFloatArray, we know this version of this method will only be called for true JavascriptArray, and not for
        // either of the derived native arrays, so the elements of each segment used here must be Vars. Hence, the cast is safe.
        SparseArraySegment<Var>* head = static_cast<SparseArraySegment<Var>*>(GetHead());
        uint32 toIndexTrimmed = toIndex <= head->length ? toIndex : head->length;
        for (uint32 i = fromIndex; i < toIndexTrimmed; i++)
        {
            Var element = head->GetElement(i);
            if (isSearchTaggedInt && TaggedInt::Is(element))
            {
                if (search == element)
                {
                    return i;
                }
            }
            else if (SparseArraySegment<Var>::IsMissingItem(&element))
            {
                AssertOrFailFast(false);
            }
            else if (includesAlgorithm && JavascriptConversion::SameValueZero(element, search))
            {
                //Array.prototype.includes
                return i;
            }
            else if (JavascriptOperators::StrictEqual(element, search, scriptContext))
            {
                //Array.prototype.indexOf
                return i;
            }
        }

        // Element not found in the head segment. Keep looking only if the range of indices extends past
        // the head segment.
        fromIndex = toIndex > GetHead()->length ? GetHead()->length : -1;
        return -1;
    }